

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigAssignDist1(Ivy_FraigMan_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pObj;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    p_00 = p->pManAig->vPis;
    if (p_00->nSize <= (int)uVar3) break;
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p_00,uVar3);
    Ivy_NodeAssignConst(p,pObj,(uint)((pPat[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0));
    uVar3 = uVar3 + 1;
  }
  uVar3 = p->pManAig->nObjs[1];
  uVar4 = p->nSimWords * 0x20 - 1;
  if ((int)uVar3 < (int)uVar4) {
    uVar4 = uVar3;
  }
  uVar3 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  while (uVar4 != uVar3) {
    pvVar2 = Vec_PtrEntry(p->pManAig->vPis,uVar3);
    uVar3 = uVar3 + 1;
    puVar1 = (uint *)(*(long *)((long)pvVar2 + 0x20) + 0x20 + (ulong)(uVar3 >> 5) * 4);
    *puVar1 = *puVar1 ^ 1 << ((byte)uVar3 & 0x1f);
  }
  return;
}

Assistant:

void Ivy_FraigAssignDist1( Ivy_FraigMan_t * p, unsigned * pPat )
{
    Ivy_Obj_t * pObj;
    int i, Limit;
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        Ivy_NodeAssignConst( p, pObj, Ivy_InfoHasBit(pPat, i) );
//        printf( "%d", Ivy_InfoHasBit(pPat, i) );
    }
//    printf( "\n" );

    Limit = IVY_MIN( Ivy_ManPiNum(p->pManAig), p->nSimWords * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Ivy_InfoXorBit( Ivy_ObjSim( Ivy_ManPi(p->pManAig,i) )->pData, i+1 );
}